

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::setTexture(Shape *this,Texture *texture,bool resetRect)

{
  Vector2u VVar1;
  byte in_DL;
  Texture *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  Shape *in_stack_ffffffffffffffa0;
  bool local_52;
  bool local_51;
  uint uStack_40;
  uint local_3c;
  Rect<int> local_34;
  Rect<int> local_24;
  byte local_11;
  Texture *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (in_RSI != (Texture *)0x0) {
    local_51 = true;
    if (local_11 == 0) {
      local_52 = false;
      if (*(long *)(in_RDI + 0xb8) == 0) {
        in_stack_ffffffffffffffa0 = (Shape *)(in_RDI + 0xc0);
        Rect<int>::Rect(&local_24);
        local_52 = sf::operator==((Rect<int> *)in_stack_ffffffffffffffa0,&local_24);
      }
      local_51 = local_52;
    }
    if (local_51 != false) {
      VVar1 = Texture::getSize(local_10);
      local_3c = VVar1.x;
      VVar1 = Texture::getSize(local_10);
      uStack_40 = VVar1.y;
      Rect<int>::Rect(&local_34,0,0,local_3c,uStack_40);
      setTextureRect(in_stack_ffffffffffffffa0,
                     (IntRect *)CONCAT44(local_3c,in_stack_ffffffffffffff98));
    }
  }
  *(Texture **)(in_RDI + 0xb8) = local_10;
  return;
}

Assistant:

void Shape::setTexture(const Texture* texture, bool resetRect)
{
    if (texture)
    {
        // Recompute the texture area if requested, or if there was no texture & rect before
        if (resetRect || (!m_texture && (m_textureRect == IntRect())))
            setTextureRect(IntRect(0, 0, static_cast<int>(texture->getSize().x), static_cast<int>(texture->getSize().y)));
    }

    // Assign the new texture
    m_texture = texture;
}